

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_zip.c
# Opt level: O0

int archive_write_zip_close(archive_write *a)

{
  void *pvVar1;
  uint64_t u;
  int iVar2;
  uint64_t local_c0;
  uint32_t local_b0;
  uint16_t local_a0;
  uint16_t local_90;
  undefined8 *puStack_78;
  int ret;
  cd_segment *segment;
  zip_conflict *zip;
  int64_t offset_end;
  int64_t offset_start;
  uint8_t buff [64];
  archive_write *a_local;
  
  pvVar1 = a->format_data;
  local_c0 = *(uint64_t *)((long)pvVar1 + 0xb0);
  buff._56_8_ = a;
  for (puStack_78 = *(undefined8 **)((long)pvVar1 + 0x90); puStack_78 != (undefined8 *)0x0;
      puStack_78 = (undefined8 *)*puStack_78) {
    iVar2 = __archive_write_output
                      ((archive_write *)buff._56_8_,(void *)puStack_78[2],
                       puStack_78[3] - puStack_78[2]);
    if (iVar2 != 0) {
      return -0x1e;
    }
    *(long *)((long)pvVar1 + 0xb0) =
         (puStack_78[3] - puStack_78[2]) + *(long *)((long)pvVar1 + 0xb0);
  }
  u = *(uint64_t *)((long)pvVar1 + 0xb0);
  if ((((0xffffffff < (long)(u - local_c0)) || (0xffffffff < (long)local_c0)) ||
      (0xffff < *(ulong *)((long)pvVar1 + 0xa8))) || ((*(uint *)((long)pvVar1 + 0xd8) & 2) != 0)) {
    memset(&offset_start,0,0x38);
    offset_start._0_4_ = 0x6064b50;
    archive_le64enc((void *)((long)&offset_start + 4),0x2c);
    archive_le16enc(buff + 4,0x2d);
    archive_le16enc(buff + 6,0x2d);
    archive_le64enc(buff + 0x10,*(uint64_t *)((long)pvVar1 + 0xa8));
    archive_le64enc(buff + 0x18,*(uint64_t *)((long)pvVar1 + 0xa8));
    archive_le64enc(buff + 0x20,u - local_c0);
    archive_le64enc(buff + 0x28,local_c0);
    iVar2 = __archive_write_output((archive_write *)buff._56_8_,&offset_start,0x38);
    if (iVar2 != 0) {
      return -0x1e;
    }
    *(long *)((long)pvVar1 + 0xb0) = *(long *)((long)pvVar1 + 0xb0) + 0x38;
    memset(&offset_start,0,0x14);
    offset_start._0_4_ = 0x7064b50;
    archive_le32enc((void *)((long)&offset_start + 4),0);
    archive_le64enc(buff,u);
    archive_le32enc(buff + 8,1);
    iVar2 = __archive_write_output((archive_write *)buff._56_8_,&offset_start,0x14);
    if (iVar2 != 0) {
      return -0x1e;
    }
    *(long *)((long)pvVar1 + 0xb0) = *(long *)((long)pvVar1 + 0xb0) + 0x14;
  }
  memset(&offset_start,0,0x40);
  offset_start._0_4_ = 0x6054b50;
  if (*(ulong *)((long)pvVar1 + 0xa8) < 0xffff) {
    local_90 = (uint16_t)*(undefined8 *)((long)pvVar1 + 0xa8);
  }
  else {
    local_90 = 0xffff;
  }
  archive_le16enc(buff,local_90);
  if (*(ulong *)((long)pvVar1 + 0xa8) < 0xffff) {
    local_a0 = (uint16_t)*(undefined8 *)((long)pvVar1 + 0xa8);
  }
  else {
    local_a0 = 0xffff;
  }
  archive_le16enc(buff + 2,local_a0);
  if ((long)(u - local_c0) < 0xffffffff) {
    local_b0 = (int)u - (int)local_c0;
  }
  else {
    local_b0 = 0xffffffff;
  }
  archive_le32enc(buff + 4,local_b0);
  if (0xfffffffe < (long)local_c0) {
    local_c0 = 0xffffffff;
  }
  archive_le32enc(buff + 8,(uint32_t)local_c0);
  iVar2 = __archive_write_output((archive_write *)buff._56_8_,&offset_start,0x16);
  if (iVar2 == 0) {
    *(long *)((long)pvVar1 + 0xb0) = *(long *)((long)pvVar1 + 0xb0) + 0x16;
    a_local._4_4_ = 0;
  }
  else {
    a_local._4_4_ = -0x1e;
  }
  return a_local._4_4_;
}

Assistant:

static int
archive_write_zip_close(struct archive_write *a)
{
	uint8_t buff[64];
	int64_t offset_start, offset_end;
	struct zip *zip = a->format_data;
	struct cd_segment *segment;
	int ret;

	offset_start = zip->written_bytes;
	segment = zip->central_directory;
	while (segment != NULL) {
		ret = __archive_write_output(a,
		    segment->buff, segment->p - segment->buff);
		if (ret != ARCHIVE_OK)
			return (ARCHIVE_FATAL);
		zip->written_bytes += segment->p - segment->buff;
		segment = segment->next;
	}
	offset_end = zip->written_bytes;

	/* If central dir info is too large, write Zip64 end-of-cd */
	if (offset_end - offset_start > ARCHIVE_LITERAL_LL(0xffffffff)
	    || offset_start > ARCHIVE_LITERAL_LL(0xffffffff)
	    || zip->central_directory_entries > 0xffffUL
	    || (zip->flags & ZIP_FLAG_FORCE_ZIP64)) {
	  /* Zip64 end-of-cd record */
	  memset(buff, 0, 56);
	  memcpy(buff, "PK\006\006", 4);
	  archive_le64enc(buff + 4, 44);
	  archive_le16enc(buff + 12, 45);
	  archive_le16enc(buff + 14, 45);
	  /* This is disk 0 of 0. */
	  archive_le64enc(buff + 24, zip->central_directory_entries);
	  archive_le64enc(buff + 32, zip->central_directory_entries);
	  archive_le64enc(buff + 40, offset_end - offset_start);
	  archive_le64enc(buff + 48, offset_start);
	  ret = __archive_write_output(a, buff, 56);
	  if (ret != ARCHIVE_OK)
		  return (ARCHIVE_FATAL);
	  zip->written_bytes += 56;

	  /* Zip64 end-of-cd locator record. */
	  memset(buff, 0, 20);
	  memcpy(buff, "PK\006\007", 4);
	  archive_le32enc(buff + 4, 0);
	  archive_le64enc(buff + 8, offset_end);
	  archive_le32enc(buff + 16, 1);
	  ret = __archive_write_output(a, buff, 20);
	  if (ret != ARCHIVE_OK)
		  return (ARCHIVE_FATAL);
	  zip->written_bytes += 20;

	}

	/* Format and write end of central directory. */
	memset(buff, 0, sizeof(buff));
	memcpy(buff, "PK\005\006", 4);
	archive_le16enc(buff + 8, (uint16_t)zipmin(0xffffU,
		zip->central_directory_entries));
	archive_le16enc(buff + 10, (uint16_t)zipmin(0xffffU,
		zip->central_directory_entries));
	archive_le32enc(buff + 12,
		(uint32_t)zipmin(ARCHIVE_LITERAL_LL(0xffffffff),
				 (offset_end - offset_start)));
	archive_le32enc(buff + 16,
		(uint32_t)zipmin(ARCHIVE_LITERAL_LL(0xffffffff),
				 offset_start));
	ret = __archive_write_output(a, buff, 22);
	if (ret != ARCHIVE_OK)
		return (ARCHIVE_FATAL);
	zip->written_bytes += 22;
	return (ARCHIVE_OK);
}